

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  PolicyMap *pm;
  cmMakefile *pcVar2;
  cmTarget *pcVar3;
  cmTargetInternalPointer *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cmTargetInternals *__s;
  char *pcVar8;
  undefined **ppuVar9;
  pointer s;
  cmStringRange cVar10;
  cmBacktraceRange cVar11;
  string configUpper;
  string property;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  undefined1 local_128 [48];
  cmTarget *local_f8;
  allocator local_e9;
  string local_e8;
  cmTargetInternalPointer *local_c8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_c0;
  cmListFileBacktrace *local_b8;
  string *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  string local_70;
  string local_50;
  
  p_Var1 = &(this->Properties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Properties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->SystemIncludeDirectories;
  p_Var1 = &(this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Utilities)._M_t._M_impl.super__Rb_tree_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_b0 = (string *)&this->Name;
  local_78 = &(this->Name).field_2;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[2] = 0;
  (this->UtilityBacktraces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<4UL>._M_w[0] = 0;
  (this->Name)._M_dataplus._M_p = (pointer)local_78;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  local_80 = &(this->InstallPath).field_2;
  (this->InstallPath)._M_dataplus._M_p = (pointer)local_80;
  (this->InstallPath)._M_string_length = 0;
  (this->InstallPath).field_2._M_local_buf[0] = '\0';
  local_88 = &(this->RuntimeInstallPath).field_2;
  (this->RuntimeInstallPath)._M_dataplus._M_p = (pointer)local_88;
  (this->RuntimeInstallPath)._M_string_length = 0;
  (this->RuntimeInstallPath).field_2._M_local_buf[0] = '\0';
  local_90 = &this->LinkDirectories;
  memset(local_90,0,0x90);
  local_f8 = this;
  __s = (cmTargetInternals *)operator_new(0x120);
  local_c8 = &this->Internal;
  memset(__s,0,0x120);
  (this->Internal).Pointer = __s;
  local_b8 = &this->Backtrace;
  cmListFileBacktrace::cmListFileBacktrace(local_b8);
  if (mf == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmTarget.cxx"
                  ,0xb5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  std::__cxx11::string::_M_assign(local_b0);
  local_f8->TargetTypeValue = type;
  local_f8->Makefile = mf;
  local_f8->HaveInstallRule = false;
  local_f8->DLLPlatform = false;
  local_f8->IsAndroid = false;
  local_f8->IsImportedTarget = vis - VisibilityImported < 2;
  local_f8->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  local_f8->BuildInterfaceIncludesAppended = false;
  local_f8->RecordDependencies = type - STATIC_LIBRARY < 3;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"WIN32","");
  bVar5 = cmMakefile::IsOn(mf,(string *)local_128);
  if (!bVar5) {
    pcVar2 = local_f8->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CYGWIN","");
    bVar6 = cmMakefile::IsOn(pcVar2,&local_70);
    if (!bVar6) {
      pcVar2 = local_f8->Makefile;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"MINGW","");
      bVar6 = cmMakefile::IsOn(pcVar2,&local_e8);
      local_f8->DLLPlatform = bVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00396896;
    }
  }
  local_f8->DLLPlatform = true;
LAB_00396896:
  if ((!bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  pcVar2 = local_f8->Makefile;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CMAKE_SYSTEM_NAME","");
  pcVar8 = cmMakefile::GetSafeDefinition(pcVar2,(string *)local_128);
  iVar7 = strcmp(pcVar8,"Android");
  local_f8->IsAndroid = iVar7 == 0;
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((local_f8->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ANDROID_API","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ANDROID_API_MIN","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ANDROID_ARCH","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ANDROID_STL_TYPE","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ANDROID_SKIP_ANT_STEP","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ANDROID_PROCESS_MAX","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ANDROID_PROGUARD","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_PROGUARD_CONFIG_PATH","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_SECURE_PROPS_PATH","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_NATIVE_LIB_DIRECTORIES","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_NATIVE_LIB_DEPENDENCIES","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_JAVA_SOURCE_DIR","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_JAR_DIRECTORIES","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_JAR_DEPENDENCIES","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_ASSETS_DIRECTORIES","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ANDROID_ANT_ADDITIONAL_OPTIONS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"BUILD_RPATH","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"INSTALL_NAME_DIR","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"INSTALL_RPATH","");
    SetPropertyDefault(local_f8,(string *)local_128,"");
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"INSTALL_RPATH_USE_LINK_PATH","");
    SetPropertyDefault(local_f8,(string *)local_128,"OFF");
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"INTERPROCEDURAL_OPTIMIZATION","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"SKIP_BUILD_RPATH","");
    SetPropertyDefault(local_f8,(string *)local_128,"OFF");
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"BUILD_WITH_INSTALL_RPATH","");
    SetPropertyDefault(local_f8,(string *)local_128,"OFF");
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"ARCHIVE_OUTPUT_DIRECTORY","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"LIBRARY_OUTPUT_DIRECTORY","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"RUNTIME_OUTPUT_DIRECTORY","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"PDB_OUTPUT_DIRECTORY","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"COMPILE_PDB_OUTPUT_DIRECTORY","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Fortran_FORMAT","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"Fortran_MODULE_DIRECTORY","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"GNUtoMS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"OSX_ARCHITECTURES","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"IOS_INSTALL_COMBINED","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AUTOMOC","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AUTOUIC","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AUTORCC","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AUTOMOC_DEPEND_FILTERS","")
    ;
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AUTOMOC_MOC_OPTIONS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AUTOUIC_OPTIONS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AUTOUIC_SEARCH_PATHS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"AUTORCC_OPTIONS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"LINK_DEPENDS_NO_SHARED","")
    ;
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"LINK_INTERFACE_LIBRARIES","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"WIN32_EXECUTABLE","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"MACOSX_BUNDLE","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"MACOSX_RPATH","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"BUILD_WITH_INSTALL_NAME_DIR","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C_CLANG_TIDY","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C_COMPILER_LAUNCHER","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C_CPPLINT","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C_INCLUDE_WHAT_YOU_USE","")
    ;
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"LINK_WHAT_YOU_USE","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C_STANDARD","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C_STANDARD_REQUIRED","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C_EXTENSIONS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CXX_CLANG_TIDY","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CXX_COMPILER_LAUNCHER","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CXX_CPPLINT","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"CXX_INCLUDE_WHAT_YOU_USE","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CXX_STANDARD","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CXX_STANDARD_REQUIRED","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CXX_EXTENSIONS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CUDA_STANDARD","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CUDA_STANDARD_REQUIRED","")
    ;
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CUDA_EXTENSIONS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CUDA_COMPILER_LAUNCHER","")
    ;
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"LINK_SEARCH_START_STATIC","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"LINK_SEARCH_END_STATIC","")
    ;
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  if (local_f8->TargetTypeValue != UTILITY) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"NO_SYSTEM_FROM_IMPORTED","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_50,mf,&local_a8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((local_f8->TargetTypeValue != UTILITY) &&
     (local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    s = local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmsys::SystemTools::UpperCase((string *)local_128,s);
      ppuVar9 = &PTR_anon_var_dwarf_7d5db1_007890d8;
      pcVar8 = "ARCHIVE_OUTPUT_DIRECTORY_";
      do {
        if ((local_f8->TargetTypeValue != INTERFACE_LIBRARY) ||
           (iVar7 = strcmp(pcVar8,"MAP_IMPORTED_CONFIG_"), iVar7 == 0)) {
          std::__cxx11::string::string((string *)&local_e8,pcVar8,&local_e9);
          std::__cxx11::string::_M_append((char *)&local_e8,local_128._0_8_);
          SetPropertyDefault(local_f8,&local_e8,(char *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar8 = *ppuVar9;
        ppuVar9 = ppuVar9 + 1;
      } while (pcVar8 != (char *)0x0);
      if ((local_f8->TargetTypeValue != EXECUTABLE) &&
         (local_f8->TargetTypeValue != INTERFACE_LIBRARY)) {
        cmsys::SystemTools::UpperCase(&local_e8,s);
        std::__cxx11::string::append((char *)&local_e8);
        SetPropertyDefault(local_f8,&local_e8,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      s = s + 1;
    } while (s != local_a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmMakefile::GetBacktrace((cmListFileBacktrace *)local_128,local_f8->Makefile);
  cmListFileBacktrace::operator=(local_b8,(cmListFileBacktrace *)local_128);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_128);
  pcVar3 = local_f8;
  if (local_f8->IsImportedTarget == false) {
    cVar10 = cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_(local_f8->Makefile);
    cVar11 = cmMakefile::GetIncludeDirectoriesBacktraces(pcVar3->Makefile);
    pcVar4 = local_c8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               local_c8->Pointer,
               (local_c8->Pointer->IncludeDirectoriesEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar10.Begin._M_current._M_current,
               cVar10.End._M_current._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar4->Pointer->IncludeDirectoriesBacktraces,
               (pcVar4->Pointer->IncludeDirectoriesBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar11.Begin._M_current._M_current,
               cVar11.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128,&(local_f8->Makefile->SystemIncludeDirectories)._M_t);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              (local_c0,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_128._24_8_,(_Base_ptr)(local_128 + 8));
    pcVar3 = local_f8;
    cVar10 = cmMakefile::GetCompileOptionsEntries_abi_cxx11_(local_f8->Makefile);
    cVar11 = cmMakefile::GetCompileOptionsBacktraces(pcVar3->Makefile);
    pcVar4 = local_c8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_c8->Pointer->CompileOptionsEntries,
               (local_c8->Pointer->CompileOptionsEntries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,cVar10.Begin._M_current._M_current,
               cVar10.End._M_current._M_current);
    std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
              ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
               &pcVar4->Pointer->CompileOptionsBacktraces,
               (pcVar4->Pointer->CompileOptionsBacktraces).
               super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl
               .super__Vector_impl_data._M_finish,cVar11.Begin._M_current._M_current,
               cVar11.End._M_current._M_current);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
  }
  if ((local_f8->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C_VISIBILITY_PRESET","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CXX_VISIBILITY_PRESET","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CUDA_VISIBILITY_PRESET","")
    ;
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"VISIBILITY_INLINES_HIDDEN","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  if (local_f8->TargetTypeValue == EXECUTABLE) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ANDROID_GUI","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"CROSSCOMPILING_EMULATOR","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"ENABLE_EXPORTS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  if ((local_f8->TargetTypeValue & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"POSITION_INDEPENDENT_CODE","");
    SetProperty(local_f8,(string *)local_128,"True");
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  if ((local_f8->TargetTypeValue & ~SHARED_LIBRARY) == EXECUTABLE) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  if ((local_f8->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,"POSITION_INDEPENDENT_CODE","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  pm = &local_f8->PolicyMap;
  cmMakefile::RecordPolicies(local_f8->Makefile,pm);
  if (local_f8->TargetTypeValue == INTERFACE_LIBRARY) {
    cmPolicies::PolicyMap::Set(pm,CMP0022,NEW);
  }
  if ((local_f8->TargetTypeValue | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"JOB_POOL_COMPILE","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"JOB_POOL_LINK","");
    SetPropertyDefault(local_f8,(string *)local_128,(char *)0x0);
    if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
{
  assert(mf);
  this->Name = name;
  this->TargetTypeValue = type;
  this->Makefile = mf;
  this->HaveInstallRule = false;
  this->DLLPlatform = false;
  this->IsAndroid = false;
  this->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  this->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  this->BuildInterfaceIncludesAppended = false;

  // only add dependency information for library targets
  if (this->TargetTypeValue >= cmStateEnums::STATIC_LIBRARY &&
      this->TargetTypeValue <= cmStateEnums::MODULE_LIBRARY) {
    this->RecordDependencies = true;
  } else {
    this->RecordDependencies = false;
  }

  // Check whether this is a DLL platform.
  this->DLLPlatform =
    (this->Makefile->IsOn("WIN32") || this->Makefile->IsOn("CYGWIN") ||
     this->Makefile->IsOn("MINGW"));

  // Check whether we are targeting an Android platform.
  this->IsAndroid =
    strcmp(this->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME"),
           "Android") == 0;

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("ANDROID_API", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_API_MIN", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ARCH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_STL_TYPE", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_SKIP_ANT_STEP", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROCESS_MAX", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROGUARD", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_PROGUARD_CONFIG_PATH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_SECURE_PROPS_PATH", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_NATIVE_LIB_DEPENDENCIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAVA_SOURCE_DIR", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAR_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_JAR_DEPENDENCIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ASSETS_DIRECTORIES", CM_NULLPTR);
    this->SetPropertyDefault("ANDROID_ANT_ADDITIONAL_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("BUILD_RPATH", CM_NULLPTR);
    this->SetPropertyDefault("INSTALL_NAME_DIR", CM_NULLPTR);
    this->SetPropertyDefault("INSTALL_RPATH", "");
    this->SetPropertyDefault("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    this->SetPropertyDefault("INTERPROCEDURAL_OPTIMIZATION", CM_NULLPTR);
    this->SetPropertyDefault("SKIP_BUILD_RPATH", "OFF");
    this->SetPropertyDefault("BUILD_WITH_INSTALL_RPATH", "OFF");
    this->SetPropertyDefault("ARCHIVE_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("LIBRARY_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("RUNTIME_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("PDB_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("COMPILE_PDB_OUTPUT_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("Fortran_FORMAT", CM_NULLPTR);
    this->SetPropertyDefault("Fortran_MODULE_DIRECTORY", CM_NULLPTR);
    this->SetPropertyDefault("GNUtoMS", CM_NULLPTR);
    this->SetPropertyDefault("OSX_ARCHITECTURES", CM_NULLPTR);
    this->SetPropertyDefault("IOS_INSTALL_COMBINED", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC", CM_NULLPTR);
    this->SetPropertyDefault("AUTORCC", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC_DEPEND_FILTERS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOMOC_MOC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("AUTOUIC_SEARCH_PATHS", CM_NULLPTR);
    this->SetPropertyDefault("AUTORCC_OPTIONS", CM_NULLPTR);
    this->SetPropertyDefault("LINK_DEPENDS_NO_SHARED", CM_NULLPTR);
    this->SetPropertyDefault("LINK_INTERFACE_LIBRARIES", CM_NULLPTR);
    this->SetPropertyDefault("WIN32_EXECUTABLE", CM_NULLPTR);
    this->SetPropertyDefault("MACOSX_BUNDLE", CM_NULLPTR);
    this->SetPropertyDefault("MACOSX_RPATH", CM_NULLPTR);
    this->SetPropertyDefault("BUILD_WITH_INSTALL_NAME_DIR", CM_NULLPTR);
    this->SetPropertyDefault("C_CLANG_TIDY", CM_NULLPTR);
    this->SetPropertyDefault("C_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("C_CPPLINT", CM_NULLPTR);
    this->SetPropertyDefault("C_INCLUDE_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("LINK_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("C_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("C_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("C_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CXX_CLANG_TIDY", CM_NULLPTR);
    this->SetPropertyDefault("CXX_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("CXX_CPPLINT", CM_NULLPTR);
    this->SetPropertyDefault("CXX_INCLUDE_WHAT_YOU_USE", CM_NULLPTR);
    this->SetPropertyDefault("CXX_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("CXX_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("CXX_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_STANDARD", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_STANDARD_REQUIRED", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_EXTENSIONS", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_COMPILER_LAUNCHER", CM_NULLPTR);
    this->SetPropertyDefault("LINK_SEARCH_START_STATIC", CM_NULLPTR);
    this->SetPropertyDefault("LINK_SEARCH_END_STATIC", CM_NULLPTR);
  }

  if (this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("NO_SYSTEM_FROM_IMPORTED", CM_NULLPTR);
  }

  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  mf->GetConfigurations(configNames);

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    const char* configProps[] = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_", CM_NULLPTR
    };
    for (std::vector<std::string>::iterator ci = configNames.begin();
         ci != configNames.end(); ++ci) {
      std::string configUpper = cmSystemTools::UpperCase(*ci);
      for (const char** p = configProps; *p; ++p) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(*p, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = *p;
        property += configUpper;
        this->SetPropertyDefault(property, CM_NULLPTR);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (this->TargetTypeValue != cmStateEnums::EXECUTABLE &&
          this->TargetTypeValue != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(*ci);
        property += "_POSTFIX";
        this->SetPropertyDefault(property, CM_NULLPTR);
      }
    }
  }

  // Save the backtrace of target construction.
  this->Backtrace = this->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    const cmStringRange parentIncludes =
      this->Makefile->GetIncludeDirectoriesEntries();
    const cmBacktraceRange parentIncludesBts =
      this->Makefile->GetIncludeDirectoriesBacktraces();

    this->Internal->IncludeDirectoriesEntries.insert(
      this->Internal->IncludeDirectoriesEntries.end(), parentIncludes.begin(),
      parentIncludes.end());
    this->Internal->IncludeDirectoriesBacktraces.insert(
      this->Internal->IncludeDirectoriesBacktraces.end(),
      parentIncludesBts.begin(), parentIncludesBts.end());

    const std::set<std::string> parentSystemIncludes =
      this->Makefile->GetSystemIncludeDirectories();

    this->SystemIncludeDirectories.insert(parentSystemIncludes.begin(),
                                          parentSystemIncludes.end());

    const cmStringRange parentOptions =
      this->Makefile->GetCompileOptionsEntries();
    const cmBacktraceRange parentOptionsBts =
      this->Makefile->GetCompileOptionsBacktraces();

    this->Internal->CompileOptionsEntries.insert(
      this->Internal->CompileOptionsEntries.end(), parentOptions.begin(),
      parentOptions.end());
    this->Internal->CompileOptionsBacktraces.insert(
      this->Internal->CompileOptionsBacktraces.end(), parentOptionsBts.begin(),
      parentOptionsBts.end());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("C_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("CXX_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("CUDA_VISIBILITY_PRESET", CM_NULLPTR);
    this->SetPropertyDefault("VISIBILITY_INLINES_HIDDEN", CM_NULLPTR);
  }

  if (this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("ANDROID_GUI", CM_NULLPTR);
    this->SetPropertyDefault("CROSSCOMPILING_EMULATOR", CM_NULLPTR);
    this->SetPropertyDefault("ENABLE_EXPORTS", CM_NULLPTR);
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (this->TargetTypeValue == cmStateEnums::SHARED_LIBRARY ||
      this->TargetTypeValue == cmStateEnums::EXECUTABLE) {
    this->SetPropertyDefault("WINDOWS_EXPORT_ALL_SYMBOLS", CM_NULLPTR);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("POSITION_INDEPENDENT_CODE", CM_NULLPTR);
  }

  // Record current policies for later use.
  this->Makefile->RecordPolicies(this->PolicyMap);

  if (this->TargetTypeValue == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    this->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    this->SetPropertyDefault("JOB_POOL_COMPILE", CM_NULLPTR);
    this->SetPropertyDefault("JOB_POOL_LINK", CM_NULLPTR);
  }
}